

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall
cmELFInternalImpl<cmELFTypes32>::ByteSwap
          (cmELFInternalImpl<cmELFTypes32> *this,ELF_Ehdr *elf_header)

{
  ELF_Ehdr *elf_header_local;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  cmELFByteSwap<unsigned_short>(&elf_header->e_type);
  cmELFByteSwap<unsigned_short>(&elf_header->e_machine);
  cmELFByteSwap<unsigned_int>(&elf_header->e_version);
  cmELFByteSwap<unsigned_int>(&elf_header->e_entry);
  cmELFByteSwap<unsigned_int>(&elf_header->e_phoff);
  cmELFByteSwap<unsigned_int>(&elf_header->e_shoff);
  cmELFByteSwap<unsigned_int>(&elf_header->e_flags);
  cmELFByteSwap<unsigned_short>(&elf_header->e_ehsize);
  cmELFByteSwap<unsigned_short>(&elf_header->e_phentsize);
  cmELFByteSwap<unsigned_short>(&elf_header->e_phnum);
  cmELFByteSwap<unsigned_short>(&elf_header->e_shentsize);
  cmELFByteSwap<unsigned_short>(&elf_header->e_shnum);
  cmELFByteSwap<unsigned_short>(&elf_header->e_shstrndx);
  return;
}

Assistant:

void ByteSwap(ELF_Ehdr& elf_header)
    {
    cmELFByteSwap(elf_header.e_type);
    cmELFByteSwap(elf_header.e_machine);
    cmELFByteSwap(elf_header.e_version);
    cmELFByteSwap(elf_header.e_entry);
    cmELFByteSwap(elf_header.e_phoff);
    cmELFByteSwap(elf_header.e_shoff);
    cmELFByteSwap(elf_header.e_flags);
    cmELFByteSwap(elf_header.e_ehsize);
    cmELFByteSwap(elf_header.e_phentsize);
    cmELFByteSwap(elf_header.e_phnum);
    cmELFByteSwap(elf_header.e_shentsize);
    cmELFByteSwap(elf_header.e_shnum);
    cmELFByteSwap(elf_header.e_shstrndx);
    }